

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

int zddReorderPostprocess(DdManager *table)

{
  uint uVar1;
  int iVar2;
  DdNode **__ptr;
  DdNode *pDVar3;
  _func_void_long *p_Var4;
  uint uVar5;
  uint uVar6;
  DdNode **ppDVar7;
  uint local_60;
  int shift;
  DD_OOMFP saveHandler;
  uint oldslots;
  uint slots;
  DdNode *next;
  DdNode *node;
  DdNodePtr *oldnodelist;
  DdNodePtr *nodelist;
  uint local_20;
  int posn;
  int j;
  int i;
  DdManager *table_local;
  
  if (table->reclaimed <= (double)(table->allocated / 2)) {
    for (posn = 0; p_Var4 = Extra_UtilMMoutOfMemory, posn < table->sizeZ; posn = posn + 1) {
      uVar1 = table->subtableZ[posn].slots;
      if ((table->subtableZ[posn].keys << 3 <= uVar1) && (table->initSlots < uVar1)) {
        __ptr = table->subtableZ[posn].nodelist;
        uVar5 = uVar1 >> 1;
        Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
        ppDVar7 = (DdNode **)malloc((ulong)uVar5 << 3);
        if (ppDVar7 == (DdNode **)0x0) {
          Extra_UtilMMoutOfMemory = p_Var4;
          return 1;
        }
        Extra_UtilMMoutOfMemory = p_Var4;
        table->subtableZ[posn].nodelist = ppDVar7;
        table->subtableZ[posn].slots = uVar5;
        table->subtableZ[posn].shift = table->subtableZ[posn].shift + 1;
        table->subtableZ[posn].maxKeys = uVar5 << 2;
        for (local_20 = 0; local_20 < uVar5; local_20 = local_20 + 1) {
          ppDVar7[(int)local_20] = (DdNode *)0x0;
        }
        iVar2 = table->subtableZ[posn].shift;
        for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
          next = __ptr[(int)local_20];
          while (next != (DdNode *)0x0) {
            pDVar3 = next->next;
            uVar6 = (((uint)(*(long *)(((ulong)(next->type).kids.T & 0xfffffffffffffffe) + 0x20) <<
                            1) | (uint)*(undefined8 *)&next->type & 1) * 0xc00005 +
                    ((uint)(*(long *)(((ulong)(next->type).kids.E & 0xfffffffffffffffe) + 0x20) << 1
                           ) | (uint)*(undefined8 *)((long)&next->type + 8) & 1)) * 0x40f1f9 >>
                    ((byte)iVar2 & 0x1f);
            next->next = ppDVar7[(int)uVar6];
            ppDVar7[(int)uVar6] = next;
            next = pDVar3;
          }
        }
        if (__ptr != (DdNode **)0x0) {
          free(__ptr);
        }
        table->memused = table->memused + (ulong)(uVar5 - uVar1) * 8;
        table->slots = table->slots + (uVar5 - uVar1);
        table->minDead = (uint)(long)(table->gcFrac * (double)table->slots);
        if (table->slots << 2 < table->maxCacheHard) {
          local_60 = table->slots << 2;
        }
        else {
          local_60 = table->maxCacheHard;
        }
        table->cacheSlack = local_60 + table->cacheSlots * -2;
      }
    }
  }
  return 1;
}

Assistant:

static int
zddReorderPostprocess(
  DdManager * table)
{
    int i, j, posn;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    unsigned int slots, oldslots;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_VERBOSE
    (void) fflush(table->out);
#endif

    /* If we have very many reclaimed nodes, we do not want to shrink
    ** the subtables, because this will lead to more garbage
    ** collections. More garbage collections mean shorter mean life for
    ** nodes with zero reference count; hence lower probability of finding
    ** a result in the cache.
    */
    if (table->reclaimed > table->allocated / 2) return(1);

    /* Resize subtables. */
    for (i = 0; i < table->sizeZ; i++) {
        int shift;
        oldslots = table->subtableZ[i].slots;
        if (oldslots < table->subtableZ[i].keys * DD_MAX_SUBTABLE_SPARSITY ||
            oldslots <= table->initSlots) continue;
        oldnodelist = table->subtableZ[i].nodelist;
        slots = oldslots >> 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            return(1);
        }
        table->subtableZ[i].nodelist = nodelist;
        table->subtableZ[i].slots = slots;
        table->subtableZ[i].shift++;
        table->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
#ifdef DD_VERBOSE
        (void) fprintf(table->err,
                       "shrunk layer %d (%d keys) from %d to %d slots\n",
                       i, table->subtableZ[i].keys, oldslots, slots);
#endif

        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        shift = table->subtableZ[i].shift;
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                posn = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                node->next = nodelist[posn];
                nodelist[posn] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

        table->memused += (slots - oldslots) * sizeof(DdNode *);
        table->slots += slots - oldslots;
        table->minDead = (unsigned) (table->gcFrac * (double) table->slots);
        table->cacheSlack = (int) ddMin(table->maxCacheHard,
            DD_MAX_CACHE_TO_SLOTS_RATIO*table->slots) -
            2 * (int) table->cacheSlots;
    }
    /* We don't look at the constant subtable, because it is not
    ** affected by reordering.
    */

    return(1);

}